

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O0

void __thiscall Args::Arg::process(Arg *this,Context *context)

{
  uint uVar1;
  undefined8 uVar2;
  Arg *in_RDI;
  char *in_stack_fffffffffffffe80;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  BaseException *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  CmdLine *in_stack_fffffffffffffec8;
  String *in_stack_fffffffffffffed0;
  Context *in_stack_fffffffffffffed8;
  string local_c8 [55];
  allocator local_91;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  uVar1 = (*(in_RDI->super_ArgIface)._vptr_ArgIface[6])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(in_RDI->super_ArgIface)._vptr_ArgIface[4])();
    if ((uVar1 & 1) == 0) {
      setDefined(in_RDI,true);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"Argument \"",&local_91);
      (*(in_RDI->super_ArgIface)._vptr_ArgIface[3])(local_c8);
      std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      ArgIface::cmdLine(&in_RDI->super_ArgIface);
      eatOneValue<Args::CmdLine,Args::Context>
                (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      (*(in_RDI->super_ArgIface)._vptr_ArgIface[0x14])(in_RDI,local_30);
      std::__cxx11::string::~string(local_30);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_c8);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      setDefined(in_RDI,true);
    }
    return;
  }
  uVar2 = __cxa_allocate_exception(0x30);
  __rhs = (allocator *)&stack0xfffffffffffffed7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffed8,"Argument \"",__rhs);
  (*(in_RDI->super_ArgIface)._vptr_ArgIface[3])(&stack0xfffffffffffffeb0);
  std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  std::operator+(in_stack_fffffffffffffe88,(char *)__rhs);
  BaseException::BaseException(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  __cxa_throw(uVar2,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

inline void
Arg::process( Context & context )
{
	if( !isDefined() )
	{
		if( !isWithValue() )
			setDefined( true );
		else
		{
			setValue( eatOneValue( context,
				String( SL( "Argument \"" ) ) +	name() +
					SL( "\" requires value that wasn't presented." ),
				cmdLine() ) );

			setDefined( true );
		}
	}
	else
		throw BaseException( String( SL( "Argument \"" ) ) +
			name() + SL( "\" already defined." ) );
}